

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void __thiscall
cimg_library::CImg<unsigned_int>::CImg
          (CImg<unsigned_int> *this,CImg<unsigned_int> *img,bool is_shared)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  
  puVar4 = img->_data;
  if (puVar4 != (uint *)0x0) {
    uVar1 = img->_height;
    uVar2 = img->_depth;
    uVar3 = img->_spectrum;
    uVar5 = (ulong)uVar2 * (ulong)uVar3 * (ulong)uVar1 * (ulong)img->_width;
    if (uVar5 != 0) {
      this->_width = img->_width;
      this->_height = uVar1;
      this->_depth = uVar2;
      this->_spectrum = uVar3;
      this->_is_shared = is_shared;
      if (is_shared) {
        this->_data = puVar4;
        return;
      }
      puVar4 = (uint *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
      this->_data = puVar4;
      memcpy(puVar4,img->_data,uVar5 * 4);
      return;
    }
  }
  this->_data = (uint *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_depth = 0;
  this->_spectrum = 0;
  this->_is_shared = false;
  return;
}

Assistant:

CImg(const CImg<T>& img, const bool is_shared) {
      const size_t siz = (size_t)img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        _is_shared = is_shared;
        if (_is_shared) _data = const_cast<T*>(img._data);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*img._width*img._height*img._depth*img._spectrum),
                                        img._width,img._height,img._depth,img._spectrum);
          }
          std::memcpy(_data,img._data,siz*sizeof(T));
        }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }